

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

void __thiscall
tcu::Matrix<tcu::Interval,_2,_4>::Matrix
          (Matrix<tcu::Interval,_2,_4> *this,Matrix<tcu::Interval,_2,_4> *src)

{
  bool *pbVar1;
  bool *pbVar2;
  double *pdVar3;
  double dVar4;
  int i;
  long lVar5;
  Vector<tcu::Interval,_2> *pVVar6;
  long lVar7;
  bool bVar8;
  undefined1 auStack_40 [8];
  double adStack_38 [5];
  double local_10;
  double dStack_8;
  
  lVar5 = 0;
  pVVar6 = (Vector<tcu::Interval,_2> *)this;
  do {
    lVar7 = 0x10;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)pVVar6->m_data)->m_data[0].m_data +
       lVar7 + -0x10) = 0;
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)pVVar6->m_data)->m_data[0].m_data +
       lVar7 + -8) = 0x7ff0000000000000;
      *(undefined8 *)
       (&((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)pVVar6->m_data)->m_data[0].m_data[0].m_hasNaN
       + lVar7) = 0xfff0000000000000;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x40);
    lVar7 = 0x10;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)pVVar6->m_data)->m_data[0].m_data +
       lVar7 + -0x10) = 0;
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)pVVar6->m_data)->m_data[0].m_data +
       lVar7 + -8) = 0x7ff0000000000000;
      *(undefined8 *)
       (&((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)pVVar6->m_data)->m_data[0].m_data[0].m_hasNaN
       + lVar7) = 0xfff0000000000000;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 == 0x28);
    lVar5 = lVar5 + 0x30;
    pVVar6 = pVVar6 + 1;
  } while (lVar5 != 0xc0);
  lVar5 = 0;
  do {
    lVar7 = 0x10;
    do {
      auStack_40[lVar7] = 0;
      *(undefined8 *)((long)adStack_38 + lVar7) = 0x7ff0000000000000;
      *(undefined8 *)((long)adStack_38 + lVar7 + 8) = 0xfff0000000000000;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x40);
    lVar7 = 0x10;
    do {
      auStack_40[lVar7] = 0;
      *(undefined8 *)((long)adStack_38 + lVar7) = 0x7ff0000000000000;
      *(undefined8 *)((long)adStack_38 + lVar7 + 8) = 0xfff0000000000000;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 == 0x28);
    pdVar3 = &(this->m_data).m_data[lVar5].m_data[1].m_lo;
    *pdVar3 = local_10;
    pdVar3[1] = dStack_8;
    pdVar3 = &(this->m_data).m_data[lVar5].m_data[0].m_hi;
    *pdVar3 = adStack_38[3];
    pdVar3[1] = adStack_38[4];
    pVVar6 = (this->m_data).m_data + lVar5;
    *(double *)pVVar6->m_data = adStack_38[1];
    pVVar6->m_data[0].m_lo = adStack_38[2];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  lVar5 = 0;
  do {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)&((Interval *)this)->m_hi + lVar7) =
           *(undefined8 *)((long)&((Interval *)src)->m_hi + lVar7);
      pbVar1 = &((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)&((Interval *)src)->m_hasNaN)->m_data
                [0].m_data[0].m_hasNaN + lVar7;
      dVar4 = *(double *)(pbVar1 + 8);
      pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_2>,_4> *)&((Interval *)this)->m_hasNaN)->m_data
                [0].m_data[0].m_hasNaN + lVar7;
      *(undefined8 *)pbVar2 = *(undefined8 *)pbVar1;
      *(double *)(pbVar2 + 8) = dVar4;
      lVar7 = lVar7 + 0x30;
    } while (lVar7 != 0xc0);
    this = (Matrix<tcu::Interval,_2,_4> *)((long)this + 0x18);
    src = (Matrix<tcu::Interval,_2,_4> *)((long)src + 0x18);
    bVar8 = lVar5 == 0;
    lVar5 = lVar5 + 1;
  } while (bVar8);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const Matrix<T, Rows, Cols>& src)
{
	*this = src;
}